

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

bool __thiscall
pdqsort_detail::
partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3>
          (pdqsort_detail *this,
          __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
          begin,__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                end,anon_class_16_2_405d1b53 comp)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  pair<int,_double> *ppVar4;
  pair<int,_double> *ppVar5;
  pair<int,_double> *ppVar6;
  ulong uVar7;
  bool bVar8;
  T tmp;
  anon_class_16_2_405d1b53 local_68;
  pair<int,_double> local_58;
  ulong local_40;
  pair<int,_double> *local_38;
  
  local_68.heurlp = (HighsLpRelaxation *)comp.getFixVal;
  if ((pair<int,_double> *)this == begin._M_current) {
LAB_002df4e6:
    bVar8 = true;
  }
  else {
    uVar7 = 0;
    local_68.getFixVal = (anon_class_32_4_ffb23deb *)end._M_current;
    local_38 = (pair<int,_double> *)this;
    do {
      lVar1 = -(long)this;
      do {
        lVar3 = lVar1;
        ppVar5 = (pair<int,_double> *)this;
        this = (pdqsort_detail *)(ppVar5 + 1);
        bVar8 = (pair<int,_double> *)this == begin._M_current;
        if (bVar8) goto LAB_002df4e6;
        bVar2 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          (&local_68,(pair<int,_double> *)this,ppVar5);
        lVar1 = lVar3 + -0x10;
      } while (!bVar2);
      local_58.first = ((pair<int,_double> *)this)->first;
      local_58._4_4_ = *(undefined4 *)&((pair<int,_double> *)this)->field_0x4;
      local_58.second = ppVar5[1].second;
      ppVar5 = (pair<int,_double> *)this;
      local_40 = uVar7;
      do {
        ppVar4 = ppVar5;
        ppVar5 = ppVar4 + -1;
        ppVar4->first = ppVar4[-1].first;
        ppVar4->second = ppVar4[-1].second;
        ppVar6 = local_38;
        if (ppVar5 == local_38) break;
        bVar2 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          (&local_68,&local_58,ppVar4 + -2);
        ppVar6 = ppVar5;
      } while (bVar2);
      ppVar6->first = local_58.first;
      ppVar4[-1].second = local_58.second;
      uVar7 = local_40 + (-((long)&ppVar6[-1].first + lVar3) >> 4);
    } while (uVar7 < 9);
  }
  return bVar8;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }